

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O3

_Bool tp_post_task(thread_pool_t *tp,tp_task_t *task)

{
  _Bool _Var1;
  
  if (task != (tp_task_t *)0x0 && tp != (thread_pool_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&tp->lock);
    _Var1 = queue_enqueue(&tp->task_queue,(qdata_t)task);
    pthread_mutex_unlock((pthread_mutex_t *)&tp->lock);
    if (_Var1) {
      LOCK();
      tp->active_tasks = tp->active_tasks + 1;
      UNLOCK();
      pthread_cond_signal((pthread_cond_t *)&tp->has_task);
    }
    return _Var1;
  }
  return false;
}

Assistant:

bool tp_post_task(thread_pool_t *tp, tp_task_t *task)
{
    bool status = false;
    bool posted = false;
    qdata_t data;

    if (tp == NULL || task == NULL) {
        goto EXIT;
    }

    // todo: check return value?
    data.ptr = task;
    pthread_mutex_lock(&tp->lock);
    posted = queue_enqueue(&tp->task_queue, data);
    pthread_mutex_unlock(&tp->lock);

    if (!posted) {
        goto EXIT;
    }

    __sync_add_and_fetch(&tp->active_tasks, 1);
    __sync_synchronize();

    pthread_cond_signal(&tp->has_task);

    status = true;

EXIT:
    return status;
}